

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printSomething.cpp
# Opt level: O0

int main(void)

{
  char *pcVar1;
  MatchTool *pMVar2;
  undefined1 local_200 [8];
  MatchTable mt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0 [8];
  string id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0 [8];
  string number;
  string local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [8];
  string integer;
  allocator local_89;
  string local_88 [8];
  string digit;
  allocator local_61;
  string local_60 [8];
  string letter;
  allocator local_29;
  string local_28 [8];
  string ws;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"( |\t|\n|\r)+",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_60,
             "(a|b|c|d|e|f|g|h|i|j|k|l|m|n|o|p|q|r|s|t|u|v|w|x|y|z|A|B|C|D|E|F|G|H|I|J|K|L|M|N|O|P|Q|R|S|T|U|V|W|X|Y|Z)"
             ,&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"(1|2|3|4|5|6|7|8|9|0)",&local_89);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::operator+((char *)local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"(+|-)?");
  std::operator+(local_b0,(char *)local_d0);
  std::__cxx11::string::~string(local_d0);
  std::operator+(local_190,(char *)local_b0);
  std::operator+(local_170,local_190);
  std::operator+(local_150,(char *)local_170);
  std::operator+(local_130,(char *)local_150);
  std::operator+(local_110,local_130);
  std::operator+(local_f0,(char *)local_110);
  std::__cxx11::string::~string((string *)local_110);
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::~string((string *)local_150);
  std::__cxx11::string::~string((string *)local_170);
  std::__cxx11::string::~string((string *)local_190);
  std::operator+((char *)&mt.tools.super__Vector_base<MatchTool,_std::allocator<MatchTool>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"(_|");
  std::operator+(local_1b0,
                 (char *)&mt.tools.super__Vector_base<MatchTool,_std::allocator<MatchTool>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &mt.tools.super__Vector_base<MatchTool,_std::allocator<MatchTool>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  MatchTable::MatchTable((MatchTable *)local_200);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  MatchTable::add((MatchTable *)local_200,pcVar1);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  MatchTable::add((MatchTable *)local_200,pcVar1);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  MatchTable::add((MatchTable *)local_200,pcVar1);
  MatchTable::generate((MatchTable *)local_200);
  pMVar2 = MatchTable::getTool((MatchTable *)local_200,0);
  print_tool(pMVar2,(ostream *)&std::cout);
  pMVar2 = MatchTable::getTool((MatchTable *)local_200,1);
  print_tool(pMVar2,(ostream *)&std::cout);
  pMVar2 = MatchTable::getTool((MatchTable *)local_200,2);
  print_tool(pMVar2,(ostream *)&std::cout);
  MatchTable::~MatchTable((MatchTable *)local_200);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_28);
  return 0;
}

Assistant:

int main() {
    string ws = "( |\t|\n|\r)+";
    string letter = "(a|b|c|d|e|f|g|h|i|j|k|l|m|n|o|p|q|r|s|t|u|v|w|x|y|z"
                    "|A|B|C|D|E|F|G|H|I|J|K|L|M|N|O|P|Q|R|S|T|U|V|W|X|Y|Z)";
    string digit = "(1|2|3|4|5|6|7|8|9|0)";
    string integer = "(+|-)?" + digit + "+";
    string number = integer + "(\\." + digit + "+)?" + "((e|E)" + integer + "+)?";
    string id = "(_|" + letter + ")+";

    MatchTable mt;
    mt.add(ws.c_str());
    mt.add(id.c_str());
    mt.add(number.c_str());
    mt.generate();

    print_tool(mt.getTool(0), cout);
    print_tool(mt.getTool(1), cout);
    print_tool(mt.getTool(2), cout);

}